

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[6]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  ulong unaff_RBX;
  ulong uVar9;
  ulong uVar10;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(params + 8) == 0) {
    bVar4 = false;
  }
  else {
    lVar8 = *(long *)params;
    s.size_ = 5;
    s.ptr = (uchar *)"corge";
    uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    lVar2 = *(long *)(params[6] + 6);
    uVar3 = *(ulong *)(params + 8);
    uVar9 = (ulong)((int)uVar3 - 1U & uVar5);
    uVar1 = *(uint *)(lVar2 + 4 + uVar9 * 8);
    unaff_RBX = (ulong)uVar1;
    if (uVar1 == 0) {
      bVar4 = false;
    }
    else {
      puVar7 = (uint *)(uVar9 * 8 + lVar2);
      do {
        if (((((int)unaff_RBX != 1) && (*puVar7 == uVar5)) &&
            (unaff_RBX = (ulong)((int)unaff_RBX - 2), *(long *)(lVar8 + 8 + unaff_RBX * 0x18) == 6))
           && (iVar6 = bcmp(*(void **)(lVar8 + unaff_RBX * 0x18),"corge",6), iVar6 == 0)) {
          bVar4 = true;
          break;
        }
        uVar10 = uVar9 + 1;
        bVar4 = false;
        uVar9 = 0;
        if (uVar10 != uVar3) {
          uVar9 = uVar10 & 0xffffffff;
        }
        puVar7 = (uint *)(uVar9 * 8 + lVar2);
        unaff_RBX = (ulong)puVar7[1];
      } while (puVar7[1] != 0);
    }
  }
  lVar8 = 0;
  if (bVar4) {
    lVar8 = unaff_RBX * 0x18 + *(long *)params;
  }
  *(long *)this = lVar8;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}